

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_start_twice(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  long lVar3;
  undefined4 **ppuVar4;
  uv_timer_t *puVar5;
  undefined4 *unaff_RBX;
  uv_timer_t once;
  undefined1 auStack_368 [152];
  code *pcStack_2d0;
  code *pcStack_2c8;
  code *pcStack_2c0;
  code *pcStack_2b8;
  code *pcStack_2b0;
  code *pcStack_2a8;
  code *pcStack_2a0;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 *apuStack_290 [19];
  undefined4 *apuStack_1f8 [19];
  undefined4 *puStack_160;
  undefined1 auStack_148 [152];
  code *pcStack_b0;
  undefined1 local_a0 [152];
  
  pcStack_b0 = (code *)0x1772fc;
  uVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x177309;
  iVar1 = uv_timer_init(uVar2,local_a0);
  if (iVar1 == 0) {
    pcStack_b0 = (code *)0x177329;
    iVar1 = uv_timer_start(local_a0,never_cb,86400000,0);
    if (iVar1 != 0) goto LAB_001773a9;
    pcStack_b0 = (code *)0x177345;
    iVar1 = uv_timer_start(local_a0,once_cb,10,0);
    if (iVar1 != 0) goto LAB_001773ae;
    pcStack_b0 = (code *)0x17734e;
    uVar2 = uv_default_loop();
    pcStack_b0 = (code *)0x177358;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001773b3;
    if (once_cb_called != 1) goto LAB_001773b8;
    pcStack_b0 = (code *)0x17736a;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_b0 = (code *)0x17737e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_b0 = (code *)0x177388;
    uv_run(unaff_RBX,0);
    pcStack_b0 = (code *)0x17738d;
    uVar2 = uv_default_loop();
    pcStack_b0 = (code *)0x177395;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x1773a9;
    run_test_timer_start_twice_cold_1();
LAB_001773a9:
    pcStack_b0 = (code *)0x1773ae;
    run_test_timer_start_twice_cold_2();
LAB_001773ae:
    pcStack_b0 = (code *)0x1773b3;
    run_test_timer_start_twice_cold_3();
LAB_001773b3:
    pcStack_b0 = (code *)0x1773b8;
    run_test_timer_start_twice_cold_4();
LAB_001773b8:
    pcStack_b0 = (code *)0x1773bd;
    run_test_timer_start_twice_cold_5();
  }
  pcStack_b0 = run_test_timer_init;
  run_test_timer_start_twice_cold_6();
  pcStack_b0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_148);
  if (iVar1 == 0) {
    lVar3 = uv_timer_get_repeat(auStack_148);
    if (lVar3 != 0) goto LAB_00177441;
    iVar1 = uv_is_active(auStack_148);
    if (iVar1 != 0) goto LAB_00177446;
    unaff_RBX = (undefined4 *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_00177441:
    run_test_timer_init_cold_2();
LAB_00177446:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  uStack_294 = 0;
  uStack_298 = 1;
  pcStack_2a0 = (code *)0x17746e;
  puStack_160 = unaff_RBX;
  ppuVar4 = (undefined4 **)uv_default_loop();
  pcStack_2a0 = (code *)0x17747e;
  iVar1 = uv_timer_init(ppuVar4,apuStack_1f8);
  if (iVar1 == 0) {
    pcStack_2a0 = (code *)0x17748b;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x177498;
    iVar1 = uv_timer_init(ppuVar4,apuStack_290);
    if (iVar1 != 0) goto LAB_001775e5;
    unaff_RBX = &uStack_294;
    ppuVar4 = apuStack_1f8;
    pcStack_2a0 = (code *)0x1774c0;
    apuStack_1f8[0] = unaff_RBX;
    iVar1 = uv_timer_start(ppuVar4,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_001775ea;
    ppuVar4 = apuStack_290;
    pcStack_2a0 = (code *)0x1774e3;
    apuStack_290[0] = &uStack_298;
    iVar1 = uv_timer_start(ppuVar4,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_001775ef;
    pcStack_2a0 = (code *)0x1774f0;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x1774fa;
    iVar1 = uv_run(ppuVar4,0);
    if (iVar1 != 0) goto LAB_001775f4;
    if (order_cb_called != 2) goto LAB_001775f9;
    ppuVar4 = apuStack_1f8;
    pcStack_2a0 = (code *)0x17751c;
    iVar1 = uv_timer_stop();
    if (iVar1 != 0) goto LAB_001775fe;
    ppuVar4 = apuStack_290;
    pcStack_2a0 = (code *)0x17752e;
    iVar1 = uv_timer_stop();
    if (iVar1 != 0) goto LAB_00177603;
    order_cb_called = 0;
    ppuVar4 = apuStack_290;
    pcStack_2a0 = (code *)0x177558;
    apuStack_290[0] = unaff_RBX;
    iVar1 = uv_timer_start(ppuVar4,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_00177608;
    ppuVar4 = apuStack_1f8;
    pcStack_2a0 = (code *)0x17757b;
    apuStack_1f8[0] = &uStack_298;
    iVar1 = uv_timer_start(ppuVar4,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_0017760d;
    pcStack_2a0 = (code *)0x177588;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x177592;
    iVar1 = uv_run(ppuVar4,0);
    if (iVar1 != 0) goto LAB_00177612;
    if (order_cb_called != 2) goto LAB_00177617;
    pcStack_2a0 = (code *)0x1775a4;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_2a0 = (code *)0x1775b8;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_2a0 = (code *)0x1775c2;
    uv_run(unaff_RBX,0);
    pcStack_2a0 = (code *)0x1775c7;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x1775cf;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_2a0 = (code *)0x1775e5;
    run_test_timer_order_cold_1();
LAB_001775e5:
    pcStack_2a0 = (code *)0x1775ea;
    run_test_timer_order_cold_2();
LAB_001775ea:
    pcStack_2a0 = (code *)0x1775ef;
    run_test_timer_order_cold_3();
LAB_001775ef:
    pcStack_2a0 = (code *)0x1775f4;
    run_test_timer_order_cold_4();
LAB_001775f4:
    pcStack_2a0 = (code *)0x1775f9;
    run_test_timer_order_cold_5();
LAB_001775f9:
    pcStack_2a0 = (code *)0x1775fe;
    run_test_timer_order_cold_6();
LAB_001775fe:
    pcStack_2a0 = (code *)0x177603;
    run_test_timer_order_cold_7();
LAB_00177603:
    pcStack_2a0 = (code *)0x177608;
    run_test_timer_order_cold_8();
LAB_00177608:
    pcStack_2a0 = (code *)0x17760d;
    run_test_timer_order_cold_9();
LAB_0017760d:
    pcStack_2a0 = (code *)0x177612;
    run_test_timer_order_cold_10();
LAB_00177612:
    pcStack_2a0 = (code *)0x177617;
    run_test_timer_order_cold_11();
LAB_00177617:
    pcStack_2a0 = (code *)0x17761c;
    run_test_timer_order_cold_12();
  }
  pcStack_2a0 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_2a0 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == **ppuVar4) {
    return iVar1;
  }
  pcStack_2a8 = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  pcStack_2a8 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == **ppuVar4) {
    return iVar1;
  }
  pcStack_2b0 = run_test_timer_huge_timeout;
  order_cb_b_cold_1();
  pcStack_2b8 = (code *)0x177661;
  pcStack_2b0 = (code *)unaff_RBX;
  puVar5 = (uv_timer_t *)uv_default_loop();
  pcStack_2b8 = (code *)0x177670;
  iVar1 = uv_timer_init(puVar5,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_2b8 = (code *)0x17767d;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x17768c;
    iVar1 = uv_timer_init(puVar5,&huge_timer1);
    if (iVar1 != 0) goto LAB_00177765;
    pcStack_2b8 = (code *)0x177699;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x1776a8;
    iVar1 = uv_timer_init(puVar5,&huge_timer2);
    if (iVar1 != 0) goto LAB_0017776a;
    puVar5 = &tiny_timer;
    pcStack_2b8 = (code *)0x1776ca;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0017776f;
    puVar5 = &huge_timer1;
    pcStack_2b8 = (code *)0x1776f1;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177774;
    puVar5 = &huge_timer2;
    pcStack_2b8 = (code *)0x177711;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177779;
    pcStack_2b8 = (code *)0x17771a;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x177724;
    iVar1 = uv_run(puVar5,0);
    if (iVar1 != 0) goto LAB_0017777e;
    pcStack_2b8 = (code *)0x17772d;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_2b8 = (code *)0x177741;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_2b8 = (code *)0x17774b;
    uv_run(unaff_RBX,0);
    pcStack_2b8 = (code *)0x177750;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x177758;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_2b8 = (code *)0x177765;
    run_test_timer_huge_timeout_cold_1();
LAB_00177765:
    pcStack_2b8 = (code *)0x17776a;
    run_test_timer_huge_timeout_cold_2();
LAB_0017776a:
    pcStack_2b8 = (code *)0x17776f;
    run_test_timer_huge_timeout_cold_3();
LAB_0017776f:
    pcStack_2b8 = (code *)0x177774;
    run_test_timer_huge_timeout_cold_4();
LAB_00177774:
    pcStack_2b8 = (code *)0x177779;
    run_test_timer_huge_timeout_cold_5();
LAB_00177779:
    pcStack_2b8 = (code *)0x17777e;
    run_test_timer_huge_timeout_cold_6();
LAB_0017777e:
    pcStack_2b8 = (code *)0x177783;
    run_test_timer_huge_timeout_cold_7();
  }
  pcStack_2b8 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_8();
  if (puVar5 == &tiny_timer) {
    pcStack_2c0 = (code *)0x1777a3;
    uv_close(&tiny_timer,0);
    pcStack_2c0 = (code *)0x1777b1;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  pcStack_2c0 = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_2c8 = (code *)0x1777cb;
  pcStack_2c0 = (code *)unaff_RBX;
  puVar5 = (uv_timer_t *)uv_default_loop();
  pcStack_2c8 = (code *)0x1777da;
  iVar1 = uv_timer_init(puVar5,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_2c8 = (code *)0x1777e7;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2c8 = (code *)0x1777f6;
    iVar1 = uv_timer_init(puVar5,&huge_timer1);
    if (iVar1 != 0) goto LAB_00177892;
    puVar5 = &tiny_timer;
    pcStack_2c8 = (code *)0x17781b;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_00177897;
    puVar5 = &huge_timer1;
    pcStack_2c8 = (code *)0x17783e;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_0017789c;
    pcStack_2c8 = (code *)0x177847;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2c8 = (code *)0x177851;
    iVar1 = uv_run(puVar5,0);
    if (iVar1 != 0) goto LAB_001778a1;
    pcStack_2c8 = (code *)0x17785a;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_2c8 = (code *)0x17786e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_2c8 = (code *)0x177878;
    uv_run(unaff_RBX,0);
    pcStack_2c8 = (code *)0x17787d;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2c8 = (code *)0x177885;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_2c8 = (code *)0x177892;
    run_test_timer_huge_repeat_cold_1();
LAB_00177892:
    pcStack_2c8 = (code *)0x177897;
    run_test_timer_huge_repeat_cold_2();
LAB_00177897:
    pcStack_2c8 = (code *)0x17789c;
    run_test_timer_huge_repeat_cold_3();
LAB_0017789c:
    pcStack_2c8 = (code *)0x1778a1;
    run_test_timer_huge_repeat_cold_4();
LAB_001778a1:
    pcStack_2c8 = (code *)0x1778a6;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_2c8 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (puVar5 == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX;
    }
  }
  else {
    if (puVar5 == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX;
      }
      pcStack_2d0 = (code *)0x1778dd;
      uv_close(&tiny_timer,0);
      iVar1 = uv_close(&huge_timer1,0);
      return iVar1;
    }
    pcStack_2d0 = (code *)0x177909;
    huge_repeat_cb_cold_1();
  }
  pcStack_2d0 = run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  pcStack_2d0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_368);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_368,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_00177a1d;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177a22;
    if (timer_run_once_timer_cb_called != 1) goto LAB_00177a27;
    iVar1 = uv_timer_start(auStack_368,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00177a2c;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177a31;
    if (timer_run_once_timer_cb_called != 2) goto LAB_00177a36;
    uv_close(auStack_368,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00177a40;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_00177a1d:
    run_test_timer_run_once_cold_2();
LAB_00177a22:
    run_test_timer_run_once_cold_3();
LAB_00177a27:
    run_test_timer_run_once_cold_4();
LAB_00177a2c:
    run_test_timer_run_once_cold_5();
LAB_00177a31:
    run_test_timer_run_once_cold_6();
LAB_00177a36:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_00177a40:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(timer_start_twice) {
  uv_timer_t once;
  int r;

  r = uv_timer_init(uv_default_loop(), &once);
  ASSERT(r == 0);
  r = uv_timer_start(&once, never_cb, 86400 * 1000, 0);
  ASSERT(r == 0);
  r = uv_timer_start(&once, once_cb, 10, 0);
  ASSERT(r == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(once_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}